

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

string * __thiscall fmt::v5::to_string<void*>(string *__return_storage_ptr__,v5 *this,void **value)

{
  undefined ***local_68;
  undefined8 local_60;
  basic_format_specs<char> local_58;
  undefined **local_40 [2];
  undefined8 local_30;
  undefined8 uStack_28;
  string *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_68 = local_40;
  local_30 = 0;
  uStack_28 = 0;
  local_40[0] = &PTR_grow_002a3ca0;
  local_60 = 0;
  local_58.super_align_spec.width_ = 0;
  local_58.super_align_spec.fill_ = L' ';
  local_58.super_align_spec.align_ = ALIGN_DEFAULT;
  local_58.super_core_format_specs.precision = -1;
  local_58.super_core_format_specs.flags = '\b';
  local_58.super_core_format_specs.type = 'x';
  local_20 = __return_storage_ptr__;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<unsigned_long,fmt::v5::basic_format_specs<char>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             &local_68,*(unsigned_long *)this,&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T &value) {
  std::string str;
  internal::container_buffer<std::string> buf(str);
  writer(buf).write(value);
  return str;
}